

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O0

char * Ioa_WriteAigerIntoMemory(Aig_Man_t *pMan,int *pnSize)

{
  int iVar1;
  Vec_Str_t *p;
  char *pcVar2;
  Vec_Str_t *vBuffer;
  char *pBuffer;
  int *pnSize_local;
  Aig_Man_t *pMan_local;
  
  p = Ioa_WriteAigerIntoMemoryStr(pMan);
  if (pMan->pName != (char *)0x0) {
    Vec_StrPrintStr(p,"n");
    Vec_StrPrintStr(p,pMan->pName);
    Vec_StrPush(p,'\0');
  }
  iVar1 = Vec_StrSize(p);
  *pnSize = iVar1;
  pcVar2 = Vec_StrReleaseArray(p);
  Vec_StrFree(p);
  return pcVar2;
}

Assistant:

char * Ioa_WriteAigerIntoMemory( Aig_Man_t * pMan, int * pnSize )
{
    char * pBuffer;
    Vec_Str_t * vBuffer;
    vBuffer = Ioa_WriteAigerIntoMemoryStr( pMan );
    if ( pMan->pName )
    {
        Vec_StrPrintStr( vBuffer, "n" );
        Vec_StrPrintStr( vBuffer, pMan->pName );
        Vec_StrPush( vBuffer, 0 );
    }
    // prepare the return values
    *pnSize = Vec_StrSize( vBuffer );
    pBuffer = Vec_StrReleaseArray( vBuffer );
    Vec_StrFree( vBuffer );
    return pBuffer;
}